

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

void saucy_search(Abc_Ntk_t *pNtk,saucy *s,int directed,int *colors,saucy_stats *stats)

{
  coloring *c;
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t **ppVVar9;
  int iVar10;
  Abc_Ntk_t *pAVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  char *pcVar15;
  char *pcVar16;
  Vec_Int_t **ppVVar17;
  int iVar18;
  ulong uVar19;
  code *pcVar20;
  saucy_stats *psVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  code *pcVar26;
  code *pcVar27;
  int iVar28;
  long lVar29;
  int *piVar30;
  int iVar31;
  size_t __size;
  int iVar32;
  saucy_stats *psVar33;
  bool bVar34;
  double dVar35;
  undefined1 auVar36 [12];
  int rmin;
  int lmin;
  int target;
  int local_94;
  coloring *local_90;
  Vec_Int_t **local_88;
  sim_result *local_80;
  sim_result *local_78;
  uint local_6c;
  int local_68;
  int local_64;
  saucy_stats *local_60;
  uint local_58;
  int local_54;
  void **local_50;
  long local_48;
  saucy_stats *local_40;
  int *local_38;
  
  s->pNtk = pNtk;
  local_60 = stats;
  pAVar11 = Abc_NtkDup(pNtk);
  s->pNtk_permuted = pAVar11;
  ppVVar17 = s->oDep;
  iVar18 = pNtk->vPos->nSize;
  lVar25 = (long)iVar18;
  uVar22 = pNtk->vPis->nSize + iVar18;
  __size = 0;
  if (0 < lVar25) {
    lVar12 = 0;
    do {
      __size = (long)(int)__size + (long)ppVVar17[lVar12]->nSize;
      lVar12 = lVar12 + 1;
    } while (lVar25 != lVar12);
    __size = __size * 8;
  }
  local_88 = s->iDep;
  piVar13 = (int *)calloc((long)(int)(uVar22 + 1),4);
  ppVVar9 = local_88;
  piVar14 = (int *)malloc(__size);
  if (0 < (int)uVar22) {
    uVar19 = 0;
    do {
      iVar28 = piVar13[uVar19];
      lVar12 = (long)iVar28;
      if ((long)uVar19 < lVar25) {
        pVVar4 = ppVVar17[uVar19];
        iVar31 = pVVar4->nSize;
        iVar28 = iVar31 + iVar28;
        piVar13[uVar19 + 1] = iVar28;
        if (0 < iVar31) {
          lVar29 = 0;
          do {
            if (pVVar4->nSize <= lVar29) {
LAB_002a30d4:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar14[lVar12 + lVar29] = pVVar4->pArray[lVar29] + iVar18;
            lVar1 = lVar12 + lVar29;
            lVar29 = lVar29 + 1;
          } while (lVar1 + 1 < (long)iVar28);
        }
      }
      else {
        pVVar4 = ppVVar9[uVar19 - lVar25];
        iVar31 = pVVar4->nSize;
        iVar28 = iVar31 + iVar28;
        piVar13[uVar19 + 1] = iVar28;
        if (0 < iVar31) {
          lVar29 = 0;
          do {
            if (pVVar4->nSize <= lVar29) goto LAB_002a30d4;
            piVar14[lVar12 + lVar29] = pVVar4->pArray[lVar29];
            lVar1 = lVar12 + lVar29;
            lVar29 = lVar29 + 1;
          } while (lVar1 + 1 < (long)iVar28);
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar22);
  }
  bVar34 = directed == 0;
  pcVar20 = is_directed_automorphism;
  if (bVar34) {
    pcVar20 = is_undirected_automorphism;
  }
  pcVar26 = ref_singleton_directed;
  if (bVar34) {
    pcVar26 = ref_singleton_undirected;
  }
  pcVar27 = ref_nonsingle_directed;
  if (bVar34) {
    pcVar27 = ref_nonsingle_undirected;
  }
  s->n = uVar22;
  s->depAdj = piVar13;
  s->depEdg = piVar14;
  s->stats = local_60;
  s->is_automorphism = pcVar20;
  s->ref_singleton = pcVar26;
  s->ref_nonsingle = pcVar27;
  s->indmin = 0;
  s->lev = 1;
  s->anc = 1;
  s->ndiffnons = 0;
  s->nundiffs = 0;
  s->ndiffs = 0;
  s->activityInc = 1.0;
  if ((int)uVar22 < 1) {
LAB_002a2402:
    s->npairs = 0;
  }
  else {
    piVar13 = s->theta;
    lVar25 = 0;
    do {
      piVar13[lVar25] = (int)lVar25;
      lVar25 = lVar25 + 1;
    } while (lVar25 < s->n);
    if (s->n < 1) goto LAB_002a2402;
    piVar13 = s->gamma;
    lVar25 = 0;
    do {
      piVar13[lVar25] = (int)lVar25;
      lVar25 = lVar25 + 1;
    } while (lVar25 < s->n);
    if (s->n < 1) goto LAB_002a2402;
    piVar13 = s->thsize;
    lVar25 = 0;
    do {
      piVar13[lVar25] = 1;
      lVar25 = lVar25 + 1;
    } while (lVar25 < s->n);
    if (s->n < 1) goto LAB_002a2402;
    piVar13 = s->thnext;
    piVar14 = s->thprev;
    lVar25 = 0;
    do {
      piVar13[lVar25] = (int)lVar25;
      piVar14[lVar25] = (int)lVar25;
      lVar25 = lVar25 + 1;
    } while (lVar25 < s->n);
    s->npairs = 0;
    if (0 < s->n) {
      piVar13 = s->unpairs;
      lVar25 = 0;
      do {
        piVar13[lVar25] = -1;
        lVar25 = lVar25 + 1;
      } while (lVar25 < s->n);
      if (0 < s->n) {
        piVar13 = s->undiffnons;
        lVar25 = 0;
        do {
          piVar13[lVar25] = -1;
          lVar25 = lVar25 + 1;
        } while (lVar25 < s->n);
        bVar34 = 0 < s->n;
        goto LAB_002a240f;
      }
    }
  }
  bVar34 = false;
LAB_002a240f:
  local_60->grpsize_base = 1.0;
  uVar22 = 0;
  local_60->grpsize_exp = 0;
  auVar36 = ZEXT812(1);
  local_60->nodes = auVar36._0_4_;
  local_60->bads = auVar36._4_4_;
  local_60->gens = auVar36._8_4_;
  local_60->support = 0;
  s->nninduce = 0;
  s->nsinduce = 0;
  s->csize = 0;
  piVar13 = s->ccount;
  if (bVar34) {
    lVar25 = 0;
    uVar22 = 0;
    do {
      piVar13[colors[lVar25]] = piVar13[colors[lVar25]] + 1;
      if ((int)uVar22 <= colors[lVar25]) {
        uVar22 = colors[lVar25];
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < s->n);
  }
  s->nsplits = uVar22 + 1;
  piVar14 = (s->left).clen;
  *piVar14 = *piVar13 + -1;
  if (0 < (int)uVar22) {
    iVar18 = *piVar13;
    uVar19 = 0;
    do {
      piVar14[iVar18] = piVar13[uVar19 + 1] + -1;
      iVar18 = piVar13[uVar19 + 1] + piVar13[uVar19];
      piVar13[uVar19 + 1] = iVar18;
      uVar19 = uVar19 + 1;
    } while (uVar22 != uVar19);
  }
  if (0 < s->n) {
    piVar5 = (s->left).lab;
    piVar30 = (s->left).unlab;
    lVar25 = 0;
    do {
      iVar18 = piVar13[colors[lVar25]];
      iVar28 = iVar18 + -1;
      piVar13[colors[lVar25]] = iVar28;
      piVar5[(long)iVar18 + -1] = (int)lVar25;
      piVar30[lVar25] = iVar28;
      lVar25 = lVar25 + 1;
    } while (lVar25 < s->n);
  }
  local_90 = &s->left;
  iVar31 = 0;
  memset(piVar13,0,(ulong)(uVar22 + 1) << 2);
  iVar18 = s->n;
  iVar28 = -1;
  if (0 < iVar18) {
    do {
      if (piVar14[iVar31] == 0) {
        piVar13 = s->sinduce;
        iVar18 = s->nsinduce;
        s->nsinduce = iVar18 + 1;
      }
      else {
        piVar13 = s->ninduce;
        iVar18 = s->nninduce;
        s->nninduce = iVar18 + 1;
      }
      piVar13[iVar18] = iVar31;
      s->indmark[iVar31] = '\x01';
      piVar14 = (s->left).clen;
      iVar18 = piVar14[iVar31];
      if (iVar31 <= iVar18 + iVar31) {
        piVar13 = (s->left).cfront;
        piVar5 = (s->left).lab;
        lVar25 = 0;
        do {
          piVar13[piVar5[iVar31 + lVar25]] = iVar31;
          lVar25 = lVar25 + 1;
        } while (iVar18 + 1 != (int)lVar25);
        iVar18 = piVar14[iVar31];
      }
      iVar31 = iVar31 + iVar18 + 1;
      iVar18 = s->n;
    } while (iVar31 < iVar18);
    if (0 < iVar18) {
      iVar28 = -1;
      iVar31 = 0;
      do {
        if (piVar14[iVar31] == 0) {
          iVar23 = 0;
        }
        else {
          s->prevnon[iVar31] = iVar28;
          s->nextnon[iVar28] = iVar31;
          iVar23 = piVar14[iVar31];
          iVar18 = s->n;
          iVar28 = iVar31;
        }
        iVar31 = iVar31 + iVar23 + 1;
      } while (iVar31 < iVar18);
    }
  }
  s->prevnon[iVar18] = iVar28;
  s->nextnon[iVar28] = s->n;
  s->split = split_init;
  s->refineBySim1 = refineBySim1_init;
  s->refineBySim2 = refineBySim2_init;
  printf("Initial Refine by Dependency graph ... ");
  s->adj = s->depAdj;
  s->edg = s->depEdg;
  refine(s,local_90);
  puts("done!");
  printf("Initial Refine by Simulation ... ");
  puts("done!\n\t--------------------");
  s->refineBySim1 = refineBySim1_left;
  s->refineBySim2 = refineBySim2_left;
  do {
    iVar18 = s->n;
    if (s->nsplits == iVar18) {
      s->splitlev[s->lev] = iVar18;
      break;
    }
    iVar28 = s->pNtk->vPos->nSize;
    if (s->nextnon[-1] < iVar28) {
      iVar18 = iVar28;
      iVar28 = s->nextnon[-1];
    }
    iVar18 = select_smallest_max_connected_cell(s,iVar28,iVar18);
    if (s->fPrintTree != 0) {
      pcVar15 = getVertexName(s->pNtk,(s->left).lab[iVar18]);
      pcVar16 = getVertexName(s->pNtk,(s->left).lab[iVar18]);
      printf("%s->%s\n",pcVar15,pcVar16);
    }
    s->splitvar[s->lev] = (s->left).lab[iVar18];
    s->start[s->lev] = iVar18;
    s->splitlev[s->lev] = s->nsplits;
    iVar18 = descend(s,local_90,iVar18,iVar18);
  } while (iVar18 != 0);
  s->split = split_other;
  s->refineBySim1 = refineBySim1_other;
  s->refineBySim2 = refineBySim2_other;
  s->anc = s->lev;
  s->stats->levels = s->lev;
  c = &s->right;
  memcpy((s->right).lab,(s->left).lab,(long)s->n << 2);
  memcpy((s->right).unlab,(s->left).unlab,(long)s->n << 2);
  memcpy((s->right).clen,(s->left).clen,(long)s->n << 2);
  memcpy((s->right).cfront,(s->left).cfront,(long)s->n << 2);
  memcpy(s->threp,(s->left).lab,(long)s->n << 2);
  memcpy(s->thfront,(s->left).unlab,(long)s->n << 2);
  s->select_decomposition = select_statically;
  do {
    unprepare_permutation(s);
    if (s->anc < s->lev) {
      s->lev = s->anc + 1;
    }
    iVar18 = s->nsplits;
    iVar31 = backtrack_loop(s);
    iVar28 = s->nsplits;
    s->nsplits = iVar18;
    rewind_coloring(s,local_90,s->lev + 1);
    s->nsplits = iVar28;
    if ((s->fBooleanMatching != 0) &&
       ((1.0 < s->stats->grpsize_base || (0 < s->stats->grpsize_exp)))) {
      return;
    }
    uVar22 = s->lev;
    if (0 < (int)uVar22 && s->fPrintTree != 0) {
      pcVar15 = getVertexName(s->pNtk,(s->left).lab[s->splitwho[iVar28]]);
      pcVar16 = getVertexName(s->pNtk,(s->right).lab[iVar31]);
      printf("in level %d: %s->%s\n",(ulong)uVar22,pcVar15,pcVar16);
      uVar22 = s->lev;
    }
joined_r0x002a295c:
    if (uVar22 == 0) {
LAB_002a308f:
      psVar33 = s->stats;
      dVar35 = psVar33->grpsize_base;
      if (dVar35 < 10.0) {
        return;
      }
      iVar18 = psVar33->grpsize_exp;
      do {
        dVar35 = dVar35 / 10.0;
        iVar18 = iVar18 + 1;
      } while (10.0 <= dVar35);
      psVar33->grpsize_base = dVar35;
      psVar33->grpsize_exp = iVar18;
      return;
    }
    iVar18 = s->start[(int)uVar22];
    while( true ) {
      iVar18 = descend(s,c,iVar18,iVar31);
      if ((iVar18 == 0) || (s->nsplits != s->splitlev[s->lev])) goto LAB_002a2b40;
      if (s->nsplits == s->n) break;
      (*s->select_decomposition)(s,&local_64,&local_68,&local_94);
      if (s->fPrintTree != 0) {
        uVar22 = s->lev;
        pcVar15 = getVertexName(s->pNtk,(s->left).lab[local_68]);
        pcVar16 = getVertexName(s->pNtk,(s->right).lab[local_94]);
        printf("in level %d: %s->%s\n",(ulong)uVar22,pcVar15,pcVar16);
      }
      s->match = 0;
      s->start[s->lev] = local_64;
      s->split = split_left;
      descend(s,local_90,local_64,local_68);
      piVar13 = s->splitlev;
      piVar13[s->lev] = s->nsplits;
      s->split = split_other;
      iVar18 = s->lev;
      s->lev = iVar18 + -1;
      s->nsplits = piVar13[(long)iVar18 + -1];
      s->specmin[(long)iVar18 + -1] = (s->right).lab[local_94];
      iVar18 = local_64;
      iVar31 = local_94;
    }
    if (0 < s->ndiffs) {
      piVar13 = (s->right).unlab;
      piVar14 = s->diffs;
      piVar5 = (s->left).lab;
      piVar30 = (s->right).lab;
      piVar6 = s->unsupp;
      piVar7 = s->gamma;
      lVar25 = 0;
      do {
        iVar18 = piVar13[piVar14[lVar25]];
        iVar28 = piVar5[iVar18];
        piVar6[lVar25] = iVar28;
        piVar7[iVar28] = piVar30[iVar18];
        lVar25 = lVar25 + 1;
      } while (lVar25 < s->ndiffs);
    }
    prepare_permutation_ntk(s);
    iVar18 = (*s->is_automorphism)(s);
    if (iVar18 == 0) {
      unprepare_permutation(s);
LAB_002a2b40:
      piVar13 = &s->stats->bads;
      *piVar13 = *piVar13 + 1;
      local_48 = (long)s->lev;
      iVar31 = backtrack_loop(s);
      uVar22 = s->lev;
      local_6c = uVar22;
LAB_002a2b6c:
      pVVar8 = s->satCounterExamples;
      iVar18 = pVVar8->nSize;
      psVar33 = (saucy_stats *)(long)iVar18;
      ppVVar17 = (Vec_Int_t **)calloc((size_t)psVar33,4);
      if (psVar33 != (saucy_stats *)0x0) {
        local_88 = ppVVar17;
        local_58 = uVar22;
        local_54 = iVar31;
        if (0 < iVar18) {
          local_50 = pVVar8->pArray;
          psVar21 = (saucy_stats *)0x0;
          do {
            local_40 = psVar21;
            local_80 = (sim_result *)local_50[(long)local_40];
            psVar21 = (saucy_stats *)0x0;
            do {
              local_60 = psVar33;
              if (*(int *)((long)ppVVar17 + (long)psVar21 * 4) == 0) {
                local_78 = (sim_result *)local_50[(long)psVar21];
                iVar18 = s->pNtk->vPos->nSize;
                iVar28 = s->pNtk->vPis->nSize;
                if (0 < iVar28) {
                  piVar13 = local_78->inVec;
                  lVar25 = (long)iVar18;
                  piVar14 = (s->left).lab;
                  local_38 = (s->right).clen;
                  iVar23 = iVar18;
                  do {
                    iVar10 = local_80->inVec[piVar14[iVar23] - lVar25];
                    iVar24 = local_38[iVar23];
                    if (iVar24 < 1) {
                      iVar32 = piVar13[c->lab[iVar23] - lVar25];
                    }
                    else {
                      lVar29 = (long)(iVar23 + 1) + -1;
                      lVar12 = lVar29;
                      do {
                        if (iVar10 != local_80->inVec[piVar14[lVar12 + 1] - lVar25])
                        goto LAB_002a2d93;
                        lVar12 = lVar12 + 1;
                      } while (lVar12 < iVar23 + iVar24);
                      iVar32 = piVar13[c->lab[iVar23] - lVar25];
                      do {
                        if (iVar32 != piVar13[c->lab[lVar29 + 1] - lVar25]) goto LAB_002a2bd4;
                        lVar29 = lVar29 + 1;
                      } while (lVar29 < iVar23 + iVar24);
                    }
                    if (iVar10 != iVar32) goto LAB_002a2bd4;
                    iVar23 = iVar24 + iVar23 + 1;
                  } while (iVar23 < iVar28 + iVar18);
                }
                if (local_80->outVecOnes != local_78->outVecOnes) {
LAB_002a2dab:
                  bumpActivity(s,local_80);
                  bumpActivity(s,local_78);
                  if (local_88 != (Vec_Int_t **)0x0) {
                    free(local_88);
                  }
                  iVar31 = backtrack_loop(s);
                  uVar22 = s->lev;
                  if (uVar22 != 0) goto LAB_002a2b6c;
                  if (s->fPrintTree == 0) goto LAB_002a308f;
                  printf("Backtrack by SAT from level %d to %d\n",(ulong)local_6c,0);
                  iVar31 = -1;
                  goto LAB_002a2ea4;
                }
                if ((iVar18 != 1) && (0 < iVar18)) {
                  iVar28 = 0;
                  do {
                    iVar23 = (s->right).clen[iVar28];
                    iVar10 = iVar28 + iVar23;
                    if (-1 < iVar23) {
                      iVar23 = iVar10;
                      if (iVar10 < iVar28) {
                        iVar23 = iVar28;
                      }
                      lVar25 = 0;
                      iVar24 = 0;
                      iVar32 = 0;
                      do {
                        iVar32 = (iVar32 + 1) -
                                 (uint)(local_80->outVec[local_90->lab[iVar28 + lVar25]] == 0);
                        iVar24 = (iVar24 + 1) -
                                 (uint)(local_78->outVec[c->lab[iVar28 + lVar25]] == 0);
                        lVar25 = lVar25 + 1;
                      } while ((iVar23 - iVar28) + 1 != (int)lVar25);
                      if (iVar32 != iVar24) goto LAB_002a2dab;
                    }
                    iVar28 = iVar10 + 1;
                  } while (iVar28 < iVar18);
                }
              }
LAB_002a2bd4:
              psVar21 = (saucy_stats *)((long)&psVar21->grpsize_base + 1);
            } while (psVar21 != psVar33);
LAB_002a2d93:
            psVar21 = (saucy_stats *)((long)&local_40->grpsize_base + 1);
          } while (psVar21 != psVar33);
        }
        if (ppVVar17 != (Vec_Int_t **)0x0) {
          free(ppVVar17);
        }
      }
      if ((int)uVar22 < (int)local_6c && s->fPrintTree != 0) {
        printf("Backtrack by SAT from level %d to %d\n",(ulong)local_6c,(ulong)uVar22);
        uVar22 = s->lev;
      }
      iVar18 = s->nsplits;
      s->nsplits = s->splitlev[local_48];
      rewind_coloring(s,local_90,uVar22 + 1);
      s->nsplits = iVar18;
LAB_002a2ea4:
      if (s->fPrintTree != 0) break;
      goto LAB_002a2f19;
    }
    psVar33 = s->stats;
    iVar18 = s->ndiffs;
    uVar2 = psVar33->gens;
    uVar3 = psVar33->support;
    psVar33->gens = uVar2 + 1;
    psVar33->support = iVar18 + uVar3;
    piVar13 = s->gamma;
    piVar14 = s->unsupp;
    if (0 < iVar18) {
      piVar5 = s->theta;
      lVar25 = 0;
      do {
        iVar18 = piVar14[lVar25];
        iVar28 = iVar18;
        do {
          iVar31 = iVar28;
          iVar28 = piVar5[iVar31];
        } while (iVar31 != piVar5[iVar31]);
        iVar28 = piVar5[iVar18];
        if (iVar28 != iVar31) {
          piVar30 = piVar5 + iVar18;
          do {
            *piVar30 = iVar31;
            piVar30 = piVar5 + iVar28;
            iVar28 = *piVar30;
          } while (iVar28 != iVar31);
        }
        iVar18 = piVar13[iVar18];
        iVar28 = iVar18;
        do {
          iVar23 = iVar28;
          iVar28 = piVar5[iVar23];
        } while (iVar23 != piVar5[iVar23]);
        iVar28 = piVar5[iVar18];
        if (iVar28 != iVar23) {
          piVar30 = piVar5 + iVar18;
          do {
            *piVar30 = iVar23;
            piVar30 = piVar5 + iVar28;
            iVar28 = *piVar30;
          } while (iVar28 != iVar23);
        }
        if (iVar31 != iVar23) {
          iVar18 = iVar23;
          if (iVar31 < iVar23) {
            iVar18 = iVar31;
          }
          if (iVar23 < iVar31) {
            iVar23 = iVar31;
          }
          piVar5[iVar23] = iVar18;
          piVar30 = s->thsize + iVar18;
          *piVar30 = *piVar30 + s->thsize[iVar23];
          piVar30 = s->thnext;
          piVar6 = s->thprev;
          iVar18 = piVar30[iVar23];
          piVar30[piVar6[iVar23]] = iVar18;
          piVar6[iVar18] = piVar6[iVar23];
          s->threp[s->thfront[iVar23]] = piVar30[iVar23];
        }
        lVar25 = lVar25 + 1;
        iVar18 = s->ndiffs;
      } while (lVar25 < iVar18);
    }
    (*s->print_automorphism)(s->gFile,s->n,piVar13,iVar18,piVar14,s->marks,s->pNtk);
    unprepare_permutation(s);
  } while( true );
  puts("BAD NODE");
  uVar22 = s->lev;
  if (0 < (int)uVar22) {
    pcVar15 = getVertexName(s->pNtk,(s->left).lab[s->splitwho[s->nsplits]]);
    pcVar16 = getVertexName(s->pNtk,(s->right).lab[iVar31]);
    printf("in level %d: %s->%s\n",(ulong)uVar22,pcVar15,pcVar16);
LAB_002a2f19:
    uVar22 = s->lev;
  }
  goto joined_r0x002a295c;
}

Assistant:

void
saucy_search(
    Abc_Ntk_t * pNtk,
    struct saucy *s,
    int directed,
    const int *colors,
    struct saucy_stats *stats)
{
    int i, j, max = 0;  
    struct saucy_graph *g;

    extern Abc_Ntk_t * Abc_NtkDup( Abc_Ntk_t * pNtk );

    /* Save network information */
    s->pNtk = pNtk;
    s->pNtk_permuted = Abc_NtkDup( pNtk );  

    /* Builde dependency graph */
    g = buildDepGraph(pNtk, s->iDep, s->oDep);  

    /* Save graph information */
    s->n = g->n;
    s->depAdj = g->adj;
    s->depEdg = g->edg;
    /*s->dadj = g->adj + g->n + 1;
    s->dedg = g->edg + g->e;*/

    /* Save client information */
    s->stats = stats;       

    /* Polymorphism */
    if (directed) {
        s->is_automorphism = is_directed_automorphism;
        s->ref_singleton = ref_singleton_directed;
        s->ref_nonsingle = ref_nonsingle_directed;
    }
    else {
        s->is_automorphism = is_undirected_automorphism;
        s->ref_singleton = ref_singleton_undirected;
        s->ref_nonsingle = ref_nonsingle_undirected;
    }

    /* Initialize scalars */
    s->indmin = 0;  
    s->lev = s->anc = 1;
    s->ndiffs = s->nundiffs = s->ndiffnons = 0;
    s->activityInc = 1;

    /* The initial orbit partition is discrete */
    for (i = 0; i < s->n; ++i) {
        s->theta[i] = i;
    }

    /* The initial permutation is the identity */
    for (i = 0; i < s->n; ++i) {
        s->gamma[i] = i;
    }

    /* Initially every cell of theta has one element */
    for (i = 0; i < s->n; ++i) {
        s->thsize[i] = 1;
    }

    /* Every theta rep list is singleton */
    for (i = 0; i < s->n; ++i) {
        s->thprev[i] = s->thnext[i] = i;
    }

    /* We have no pairs yet */
    s->npairs = 0;
    for (i = 0; i < s->n; ++i) {
        s->unpairs[i] = -1;
    }

    /* Ensure no stray pointers in undiffnons, which is checked by removed_diffnon() */
    for (i = 0; i < s->n; ++i) {
        s->undiffnons[i] = -1;
    }

    /* Initialize stats */
    s->stats->grpsize_base = 1.0;
    s->stats->grpsize_exp = 0;
    s->stats->nodes = 1;
    s->stats->bads = s->stats->gens = s->stats->support = 0;

    /* Prepare for refinement */
    s->nninduce = s->nsinduce = 0;
    s->csize = 0;

    /* Count cell sizes */
    for (i = 0; i < s->n; ++i) {
        s->ccount[colors[i]]++;
        if (max < colors[i]) max = colors[i];
    }
    s->nsplits = max + 1;

    /* Build cell lengths */
    s->left.clen[0] = s->ccount[0] - 1;
    for (i = 0; i < max; ++i) {
        s->left.clen[s->ccount[i]] = s->ccount[i+1] - 1;
        s->ccount[i+1] += s->ccount[i];
    }

    /* Build the label array */
    for (i = 0; i < s->n; ++i) {
        set_label(&s->left, --s->ccount[colors[i]], i);
    }

    /* Clear out ccount */
    for (i = 0; i <= max; ++i) {
        s->ccount[i] = 0;
    }

    /* Update refinement stuff based on initial partition */
    for (i = 0; i < s->n; i += s->left.clen[i]+1) {
        add_induce(s, &s->left, i);
        fix_fronts(&s->left, i, i);
    }

    /* Prepare lists based on cell lengths */
    for (i = 0, j = -1; i < s->n; i += s->left.clen[i] + 1) {
        if (!s->left.clen[i]) continue;
        s->prevnon[i] = j;
        s->nextnon[j] = i;
        j = i;
    }

    /* Fix the end */
    s->prevnon[s->n] = j;
    s->nextnon[j] = s->n;

    /* Preprocessing after initial coloring */
    s->split = split_init;  
    s->refineBySim1 = refineBySim1_init;
    s->refineBySim2 = refineBySim2_init;    

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("Initial Refine by Dependency graph ... ");
    refineByDepGraph(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("done!\n");
    
    printf("Initial Refine by Simulation ... ");
    if (REFINE_BY_SIM_1) s->refineBySim1(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_2) s->refineBySim2(s, &s->left);
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    printf("done!\n\t--------------------\n");

    /* Descend along the leftmost branch and compute zeta */
    s->refineBySim1 = refineBySim1_left;
    s->refineBySim2 = refineBySim2_left;
    descend_leftmost(s);    
    s->split = split_other; 
    s->refineBySim1 = refineBySim1_other;
    s->refineBySim2 = refineBySim2_other;   

    /* Our common ancestor with zeta is the current level */
    s->stats->levels = s->anc = s->lev;

    /* Copy over this data to our non-leftmost coloring */
    memcpy(s->right.lab, s->left.lab, s->n * sizeof(int));
    memcpy(s->right.unlab, s->left.unlab, s->n * sizeof(int));
    memcpy(s->right.clen, s->left.clen, s->n * sizeof(int));
    memcpy(s->right.cfront, s->left.cfront, s->n * sizeof(int));

    /* The reps are just the labels at this point */
    memcpy(s->threp, s->left.lab, s->n * sizeof(int));
    memcpy(s->thfront, s->left.unlab, s->n * sizeof(int));

    /* choose cell selection method */
    if (SELECT_DYNAMICALLY) s->select_decomposition = select_dynamically;
    else                    s->select_decomposition = select_statically;

    /* Keep running till we're out of automorphisms */
    while (do_search(s));
}